

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * kwssys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(void)

{
  char *pcVar1;
  string *in_RDI;
  char *cwd;
  char buf [2048];
  string *path;
  string *this;
  string *in_stack_fffffffffffff850;
  
  this = in_RDI;
  pcVar1 = Getcwd((char *)in_RDI,(uint)((ulong)in_RDI >> 0x20));
  std::__cxx11::string::string((string *)this);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)this,pcVar1);
    ConvertToUnixSlashes(in_stack_fffffffffffff850);
  }
  return in_RDI;
}

Assistant:

std::string SystemTools::GetCurrentWorkingDirectory()
{
  char buf[2048];
  const char* cwd = Getcwd(buf, 2048);
  std::string path;
  if (cwd) {
    path = cwd;
    SystemTools::ConvertToUnixSlashes(path);
  }
  return path;
}